

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void announce_login(CHAR_DATA *ch)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char *__s;
  size_t sVar2;
  basic_string_view<char> format;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  long *local_2c8;
  undefined8 uStack_2c0;
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288;
  undefined8 uStack_280;
  buffer<char> local_278;
  char local_258 [568];
  
  if (ch->cabal < 8 && ch->cabal != 0) {
    bVar1 = is_immortal(ch);
    if (!bVar1) {
      ch_00 = get_cabal_guardian((int)ch->cabal);
      if (ch_00 != (CHAR_DATA *)0x0) {
        __s = talloc_string(cabal_messages[ch->cabal].login);
        sVar2 = strlen(__s);
        local_2a8[0] = (long *)ch->name;
        local_278.size_ = 0;
        local_278._vptr_buffer = (_func_int **)&PTR_grow_00457340;
        local_278.capacity_ = 500;
        format.size_ = sVar2;
        format.data_ = __s;
        args.field_1.values_ =
             (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_2a8;
        args.desc_ = 0xc;
        local_278.ptr_ = local_258;
        ::fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                  (&local_278,format,args);
        local_2c8 = local_2b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,local_278.ptr_,local_278.ptr_ + local_278.size_);
        if (local_278.ptr_ != local_258) {
          operator_delete(local_278.ptr_,local_278.capacity_);
        }
        local_288 = local_2c8;
        uStack_280 = uStack_2c0;
        local_278.size_ = 0;
        local_278._vptr_buffer = (_func_int **)&PTR_grow_00457340;
        local_278.capacity_ = 500;
        fmt.size_ = 0x10;
        fmt.data_ = "\x1b[1;37m{}\x1b[0;37m";
        args_00.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_288;
        args_00.desc_ = 0xd;
        local_278.ptr_ = local_258;
        ::fmt::v9::detail::vformat_to<char>(&local_278,fmt,args_00,(locale_ref)0x0);
        local_2a8[0] = local_298;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,local_278.ptr_,local_278.ptr_ + local_278.size_);
        if (local_278.ptr_ != local_258) {
          operator_delete(local_278.ptr_,local_278.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_2a8);
        if (local_2a8[0] != local_298) {
          operator_delete(local_2a8[0],local_298[0] + 1);
        }
        do_cb(ch_00,(char *)local_2c8);
        if (local_2c8 != local_2b8) {
          operator_delete(local_2c8,local_2b8[0] + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void announce_login(CHAR_DATA *ch)
{
	CHAR_DATA *guardian;
	char *rstring;

	if (ch->cabal == 0 || ch->cabal > MAX_CABAL || is_immortal(ch))
		return;

	guardian = get_cabal_guardian(ch->cabal);

	if (!guardian)
		return;

	rstring = talloc_string(cabal_messages[ch->cabal].login);

	auto buffer = fmt::sprintf(rstring, ch->name);
	buffer = fmt::format("\x01B[1;37m{}\x01B[0;37m", buffer);
	do_cb(guardian, buffer.data());
}